

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::setScheme(XMLUri *this,XMLCh *newScheme)

{
  bool bVar1;
  MalformedURLException *pMVar2;
  XMLCh *pXVar3;
  XMLCh *newScheme_local;
  XMLUri *this_local;
  
  if (newScheme == (XMLCh *)0x0) {
    pMVar2 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x463,XMLNUM_URI_Component_Set_Null,(XMLCh *)errMsg_SCHEME,(XMLCh *)0x0,(XMLCh *)0x0
               ,(XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar2,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  bVar1 = isConformantSchemeName(newScheme);
  if (!bVar1) {
    pMVar2 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x46c,XMLNUM_URI_Component_Not_Conformant,(XMLCh *)errMsg_SCHEME,newScheme,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar2,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  pXVar3 = getScheme(this);
  if (pXVar3 != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fScheme);
  }
  pXVar3 = XMLString::replicate(newScheme,this->fMemoryManager);
  this->fScheme = pXVar3;
  XMLString::lowerCase(this->fScheme);
  return;
}

Assistant:

void XMLUri::setScheme(const XMLCh* const newScheme)
{
    if ( !newScheme )
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Set_Null
                , errMsg_SCHEME
                , fMemoryManager);
    }

    if (!isConformantSchemeName(newScheme))
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Not_Conformant
                , errMsg_SCHEME
                , newScheme
                , fMemoryManager);
    }

    if (getScheme())
    {
        fMemoryManager->deallocate(fScheme);//delete [] fScheme;
    }

    fScheme = XMLString::replicate(newScheme, fMemoryManager);
    XMLString::lowerCase(fScheme);
}